

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.cpp
# Opt level: O0

var __thiscall cs::runtime_type::parse_asi(runtime_type *this,var *a,var *b)

{
  undefined8 in_RCX;
  any *in_RDX;
  any *in_RSI;
  proxy *in_RDI;
  any *in_stack_ffffffffffffff98;
  EVP_PKEY_CTX local_30 [8];
  EVP_PKEY_CTX local_28 [15];
  undefined1 raw;
  any *obj;
  
  raw = (undefined1)((ulong)in_RCX >> 0x38);
  obj = in_RDX;
  cs_impl::any::any(in_RDX,in_stack_ffffffffffffff98);
  copy(local_28,local_30);
  cs_impl::any::swap(in_RSI,obj,(bool)raw);
  cs_impl::any::~any((any *)0x50cecf);
  cs_impl::any::~any((any *)0x50ced9);
  cs_impl::any::any(in_RDX,in_stack_ffffffffffffff98);
  return (var)in_RDI;
}

Assistant:

var runtime_type::parse_asi(var a, const var &b)
	{
		a.swap(copy(b), true);
		return a;
	}